

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidexample.cpp
# Opt level: O0

void printHelp(void)

{
  std::operator<<((ostream *)&std::cerr,"syntax: deepidexample options output.deep.exr\n\n");
  std::operator<<((ostream *)&std::cerr,
                  "--multivariate      : combine \'material\' and \'model\' name into a single ID channel, rather than separate channels\n"
                 );
  std::operator<<((ostream *)&std::cerr,
                  "--64                : use 64 bit hashes in two channels, rather than a single channel 32 bit hash\n"
                 );
  std::operator<<((ostream *)&std::cerr,
                  "--frame  number     : specify animation frame number. Animation cycles every 200 frames\n"
                 );
  std::operator<<((ostream *)&std::cerr,
                  "--objectid          : store object ids in a simple stringvector format rather than the idmanifest attribute\n"
                 );
  std::operator<<((ostream *)&std::cerr,
                  "--size width height : specify image dimensions for output (default 256 256)\n");
  std::operator<<((ostream *)&std::cerr,
                  "--count number      : number of objects to write (default 100)\n");
  return;
}

Assistant:

void
printHelp ()
{
    cerr << "syntax: deepidexample options output.deep.exr\n\n";
    cerr
        << "--multivariate      : combine 'material' and 'model' name into a single ID channel, rather than separate channels\n";
    cerr
        << "--64                : use 64 bit hashes in two channels, rather than a single channel 32 bit hash\n";
    cerr
        << "--frame  number     : specify animation frame number. Animation cycles every 200 frames\n";
    cerr
        << "--objectid          : store object ids in a simple stringvector format rather than the idmanifest attribute\n";
    cerr
        << "--size width height : specify image dimensions for output (default 256 256)\n";
    cerr << "--count number      : number of objects to write (default 100)\n";
}